

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  TValue *io2;
  TValue *io1;
  TValue *io;
  TValue k;
  TValue *cell;
  TValue *p;
  TValue *value_local;
  lua_Integer key_local;
  Table *t_local;
  lua_State *L_local;
  
  k._8_8_ = luaH_getint(t,key);
  if ((TValue *)k._8_8_ == &luaO_nilobject_) {
    k.value_.b._0_2_ = 0x13;
    io = (TValue *)key;
    k._8_8_ = luaH_newkey(L,t,(TValue *)&io);
  }
  *(Value *)k._8_8_ = value->value_;
  *(LuaType *)(k._8_8_ + 8) = value->tt_;
  if ((*(ushort *)(k._8_8_ + 8) & 0x8000) != 0) {
    if ((*(ushort *)(k._8_8_ + 8) & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2f1,"void luaH_setint(lua_State *, Table *, lua_Integer, TValue *)");
    }
    if ((*(ushort *)(k._8_8_ + 8) & 0x7f) != (ushort)*(byte *)(*(long *)k._8_8_ + 8)) {
LAB_00156f16:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2f1,"void luaH_setint(lua_State *, Table *, lua_Integer, TValue *)");
    }
    if (L != (lua_State *)0x0) {
      if ((*(ushort *)(k._8_8_ + 8) & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x2f1,"void luaH_setint(lua_State *, Table *, lua_Integer, TValue *)");
      }
      if ((*(byte *)(*(long *)k._8_8_ + 9) & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00156f16;
    }
  }
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  TValue *cell;
  if (p != luaO_nilobject)
    cell = cast(TValue *, p);
  else {
    TValue k;
    setivalue(&k, key);
    cell = luaH_newkey(L, t, &k);
  }
  setobj2t(L, cell, value);
}